

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  *(undefined8 *)&this[-1].field_0x58 = 0x8a91f8;
  *(undefined8 *)&this->field_0x40 = 0x8a9310;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8a9220;
  *(undefined8 *)&this[-1].field_0xf0 = 0x8a9248;
  *(undefined8 *)&this[-1].field_0x128 = 0x8a9270;
  *(undefined8 *)&this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>.field_0x10 =
       0x8a9298;
  *(undefined8 *)this = 0x8a92c0;
  *(undefined8 *)&this->field_0x10 = 0x8a92e8;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20,*(long *)&this->field_0x30 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x58,&PTR_construction_vtable_24__008a9330);
  operator_delete(&this[-1].field_0x58,400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}